

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O3

int stb_vorbis_decode_frame_pushdata
              (stb_vorbis *f,uint8 *data,int data_len,int *channels,float ***output,int *samples)

{
  CRCscan *pCVar1;
  CRCscan *pCVar2;
  byte bVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  long lVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  uint32 uVar15;
  uint8 *puVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int left;
  int right;
  int local_60;
  int local_44;
  int local_40;
  int local_3c [3];
  long lVar24;
  
  if (f->push_mode == '\0') {
    f->error = VORBIS_invalid_api_mixing;
    return 0;
  }
  if (f->page_crc_tests < 0) {
    f->stream = data;
    f->stream_end = data + data_len;
    f->error = VORBIS__no_error;
    iVar11 = is_whole_packet_present(f);
    if (iVar11 == 0) {
      *samples = 0;
      return 0;
    }
    iVar11 = vorbis_decode_packet(f,local_3c,&local_44,&local_40);
    if (iVar11 == 0) {
      if (f->error == VORBIS_continued_packet_flag_invalid) {
        if (f->previous_length != 0) goto LAB_0014ea84;
        f->error = VORBIS__no_error;
        do {
          iVar11 = get8_packet_raw(f);
          f->valid_bits = 0;
          if (iVar11 == -1) break;
        } while (f->eof == 0);
      }
      else {
        if (f->error != VORBIS_bad_packet_type) {
LAB_0014ea84:
          f->previous_length = 0;
          f->page_crc_tests = 0;
          f->discard_samples_deferred = 0;
          f->samples_output = 0;
          f->current_loc_valid = 0;
          f->first_decode = '\0';
          f->channel_buffer_start = 0;
          f->channel_buffer_end = 0;
          *samples = 0;
          return 1;
        }
        f->error = VORBIS__no_error;
        do {
          iVar11 = get8_packet_raw(f);
          f->valid_bits = 0;
          if (iVar11 == -1) break;
        } while (f->eof == 0);
      }
      *samples = 0;
      iVar11 = *(int *)&f->stream;
    }
    else {
      iVar8 = vorbis_finish_frame(f,local_3c[0],local_44,local_40);
      iVar11 = f->channels;
      if (0 < (long)iVar11) {
        lVar6 = 0;
        do {
          f->outputs[lVar6] = f->channel_buffers[lVar6] + local_44;
          lVar6 = lVar6 + 1;
        } while (iVar11 != lVar6);
      }
      if (channels != (int *)0x0) {
        *channels = iVar11;
      }
      *samples = iVar8;
      *output = f->outputs;
      iVar11 = *(int *)&f->stream;
    }
    local_60 = (int)data;
    return iVar11 - local_60;
  }
  *samples = 0;
  auVar5 = _DAT_00178d70;
  uVar20 = f->page_crc_tests;
  uVar14 = (ulong)(int)uVar20;
  if (0 < (long)uVar14) {
    lVar6 = uVar14 - 1;
    auVar22._8_4_ = (int)lVar6;
    auVar22._0_8_ = lVar6;
    auVar22._12_4_ = (int)((ulong)lVar6 >> 0x20);
    lVar6 = 0;
    auVar22 = auVar22 ^ _DAT_00178d70;
    auVar23 = _DAT_00178d90;
    auVar25 = _DAT_00178d60;
    do {
      auVar26 = auVar25 ^ auVar5;
      iVar11 = auVar22._4_4_;
      if ((bool)(~(auVar26._4_4_ == iVar11 && auVar22._0_4_ < auVar26._0_4_ ||
                  iVar11 < auVar26._4_4_) & 1)) {
        *(undefined4 *)((long)&f->scan[0].bytes_done + lVar6) = 0;
      }
      if ((auVar26._12_4_ != auVar22._12_4_ || auVar26._8_4_ <= auVar22._8_4_) &&
          auVar26._12_4_ <= auVar22._12_4_) {
        *(undefined4 *)((long)&f->scan[1].bytes_done + lVar6) = 0;
      }
      auVar26 = auVar23 ^ auVar5;
      iVar8 = auVar26._4_4_;
      if (iVar8 <= iVar11 && (iVar8 != iVar11 || auVar26._0_4_ <= auVar22._0_4_)) {
        *(undefined4 *)((long)&f->scan[2].bytes_done + lVar6) = 0;
        *(undefined4 *)((long)&f->scan[3].bytes_done + lVar6) = 0;
      }
      lVar24 = auVar25._8_8_;
      auVar25._0_8_ = auVar25._0_8_ + 4;
      auVar25._8_8_ = lVar24 + 4;
      lVar24 = auVar23._8_8_;
      auVar23._0_8_ = auVar23._0_8_ + 4;
      auVar23._8_8_ = lVar24 + 4;
      lVar6 = lVar6 + 0x50;
    } while ((ulong)(uVar20 + 3 >> 2) * 0x50 != lVar6);
    if (3 < (int)uVar20) {
      uVar7 = (ulong)uVar20;
      goto LAB_0014eb0d;
    }
  }
  if (data_len < 4) {
    return 0;
  }
  data_len = data_len + -3;
  uVar21 = 0;
  do {
    uVar7 = uVar14 & 0xffffffff;
    iVar11 = (int)uVar21;
    uVar20 = iVar11 + 0x1b;
    lVar6 = 0;
    puVar16 = data;
    while ((iVar8 = (int)uVar14, puVar16[uVar21] != 'O' ||
           (*(uint8 (*) [4])(puVar16 + uVar21) != ogg_page_header))) {
      lVar6 = lVar6 + 1;
      puVar16 = puVar16 + 1;
      uVar20 = uVar20 + 1;
      if (data_len <= (int)lVar6 + iVar11) goto LAB_0014eafe;
    }
    uVar19 = uVar21 + lVar6 + 0x1a;
    iVar17 = (int)uVar19;
    iVar12 = (int)lVar6;
    if (data_len <= iVar17) {
LAB_0014eaf9:
      data_len = iVar11 + iVar12;
LAB_0014eafe:
      if (iVar8 < 1) {
        return data_len;
      }
      break;
    }
    uVar19 = uVar19 & 0xffffffff;
    bVar3 = data[uVar19];
    if (data_len <= (int)(iVar11 + (uint)bVar3 + iVar12 + 0x1b)) goto LAB_0014eaf9;
    iVar9 = bVar3 + 0x1b;
    if (bVar3 != 0) {
      uVar14 = 0;
      do {
        iVar9 = iVar9 + (uint)data[uVar14 + uVar20];
        uVar14 = uVar14 + 1;
      } while (bVar3 != uVar14);
    }
    uVar20 = 0;
    lVar6 = -0x16;
    do {
      uVar20 = uVar20 << 8 ^ crc_table[uVar20 >> 0x18 ^ (uint)puVar16[lVar6 + uVar21 + 0x16]];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0);
    iVar13 = 4;
    do {
      uVar20 = uVar20 << 8 ^ crc_table[uVar20 >> 0x18];
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
    uVar10 = iVar8 + 1;
    uVar14 = (ulong)uVar10;
    f->page_crc_tests = uVar10;
    f->scan[iVar8].bytes_left = iVar9 + -0x1a;
    f->scan[iVar8].crc_so_far = uVar20;
    f->scan[iVar8].goal_crc = *(uint32 *)(puVar16 + uVar21 + 0x16);
    if (data[(ulong)((uint)data[uVar19] + iVar11 + iVar12 + 0x1b) - 1] == 0xff) {
      uVar15 = 0xffffffff;
    }
    else {
      uVar15 = *(uint32 *)(puVar16 + uVar21 + 6);
    }
    f->scan[iVar8].sample_loc = uVar15;
    f->scan[iVar8].bytes_done = iVar17;
    uVar21 = (ulong)(iVar11 + iVar12 + 1);
    uVar7 = 4;
  } while (uVar10 != 4);
LAB_0014eb0d:
  iVar11 = 0;
  do {
    iVar8 = f->scan[iVar11].bytes_done;
    uVar20 = f->scan[iVar11].bytes_left;
    uVar10 = f->scan[iVar11].crc_so_far;
    uVar18 = data_len - iVar8;
    uVar4 = uVar18;
    if ((int)uVar20 < (int)uVar18) {
      uVar4 = uVar20;
    }
    if (0 < (int)uVar4) {
      uVar14 = 0;
      do {
        uVar10 = uVar10 << 8 ^ crc_table[uVar10 >> 0x18 ^ (uint)data[uVar14 + (long)iVar8]];
        uVar14 = uVar14 + 1;
      } while (uVar4 != uVar14);
    }
    pCVar1 = f->scan + iVar11;
    pCVar1->bytes_left = uVar20 - uVar4;
    pCVar1->crc_so_far = uVar10;
    if ((int)uVar18 < (int)uVar20) {
      iVar11 = iVar11 + 1;
    }
    else {
      if (uVar10 == pCVar1->goal_crc) {
        f->page_crc_tests = -1;
        f->previous_length = 0;
        f->next_seg = -1;
        uVar15 = pCVar1->sample_loc;
        f->current_loc = uVar15;
        f->current_loc_valid = (uint)(uVar15 != 0xffffffff);
        return uVar4 + iVar8;
      }
      iVar8 = (int)uVar7 + -1;
      f->page_crc_tests = iVar8;
      pCVar1->sample_loc = f->scan[iVar8].sample_loc;
      pCVar2 = f->scan + iVar8;
      iVar8 = pCVar2->bytes_left;
      uVar15 = pCVar2->crc_so_far;
      iVar12 = pCVar2->bytes_done;
      pCVar1->goal_crc = pCVar2->goal_crc;
      pCVar1->bytes_left = iVar8;
      pCVar1->crc_so_far = uVar15;
      pCVar1->bytes_done = iVar12;
      uVar7 = (ulong)(uint)f->page_crc_tests;
    }
  } while (iVar11 < (int)uVar7);
  return data_len;
}

Assistant:

int stb_vorbis_decode_frame_pushdata(
         stb_vorbis *f,                   // the file we're decoding
         const uint8 *data, int data_len, // the memory available for decoding
         int *channels,                   // place to write number of float * buffers
         float ***output,                 // place to write float ** array of float * buffers
         int *samples                     // place to write number of output samples
     )
{
   int i;
   int len,right,left;

   if (!IS_PUSH_MODE(f)) return error(f, VORBIS_invalid_api_mixing);

   if (f->page_crc_tests >= 0) {
      *samples = 0;
      return vorbis_search_for_page_pushdata(f, (uint8 *) data, data_len);
   }

   f->stream     = (uint8 *) data;
   f->stream_end = (uint8 *) data + data_len;
   f->error      = VORBIS__no_error;

   // check that we have the entire packet in memory
   if (!is_whole_packet_present(f)) {
      *samples = 0;
      return 0;
   }

   if (!vorbis_decode_packet(f, &len, &left, &right)) {
      // save the actual error we encountered
      enum STBVorbisError error = f->error;
      if (error == VORBIS_bad_packet_type) {
         // flush and resynch
         f->error = VORBIS__no_error;
         while (get8_packet(f) != EOP)
            if (f->eof) break;
         *samples = 0;
         return (int) (f->stream - data);
      }
      if (error == VORBIS_continued_packet_flag_invalid) {
         if (f->previous_length == 0) {
            // we may be resynching, in which case it's ok to hit one
            // of these; just discard the packet
            f->error = VORBIS__no_error;
            while (get8_packet(f) != EOP)
               if (f->eof) break;
            *samples = 0;
            return (int) (f->stream - data);
         }
      }
      // if we get an error while parsing, what to do?
      // well, it DEFINITELY won't work to continue from where we are!
      stb_vorbis_flush_pushdata(f);
      // restore the error that actually made us bail
      f->error = error;
      *samples = 0;
      return 1;
   }

   // success!
   len = vorbis_finish_frame(f, len, left, right);
   for (i=0; i < f->channels; ++i)
      f->outputs[i] = f->channel_buffers[i] + left;

   if (channels) *channels = f->channels;
   *samples = len;
   *output = f->outputs;
   return (int) (f->stream - data);
}